

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O1

void __thiscall
kj::BufferedOutputStreamWrapper::BufferedOutputStreamWrapper
          (BufferedOutputStreamWrapper *this,OutputStream *inner,ArrayPtr<unsigned_char> buffer)

{
  uchar *puVar1;
  size_t sVar2;
  
  sVar2 = buffer.size_;
  puVar1 = buffer.ptr;
  (this->super_BufferedOutputStream).super_OutputStream._vptr_OutputStream =
       (_func_int **)&PTR__BufferedOutputStreamWrapper_0046b160;
  this->inner = inner;
  if (sVar2 == 0) {
    puVar1 = (uchar *)_::HeapArrayDisposer::allocateImpl
                                (1,0x2000,0x2000,(_func_void_void_ptr *)0x0,
                                 (_func_void_void_ptr *)0x0);
    (this->ownedBuffer).ptr = puVar1;
    (this->ownedBuffer).size_ = 0x2000;
    (this->ownedBuffer).disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
    puVar1 = (this->ownedBuffer).ptr;
    sVar2 = (this->ownedBuffer).size_;
  }
  else {
    (this->ownedBuffer).ptr = (uchar *)0x0;
    (this->ownedBuffer).size_ = 0;
    (this->ownedBuffer).disposer = (ArrayDisposer *)0x0;
  }
  (this->buffer).ptr = puVar1;
  (this->buffer).size_ = sVar2;
  this->bufferPos = puVar1;
  UnwindDetector::UnwindDetector(&this->unwindDetector);
  return;
}

Assistant:

BufferedOutputStreamWrapper::BufferedOutputStreamWrapper(OutputStream& inner, ArrayPtr<byte> buffer)
    : inner(inner),
      ownedBuffer(buffer == nullptr ? heapArray<byte>(8192) : nullptr),
      buffer(buffer == nullptr ? ownedBuffer : buffer),
      bufferPos(this->buffer.begin()) {}